

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

bool IR::Instr::HasSymUseDst(StackSym *sym,Opnd *dst)

{
  code *pcVar1;
  OpndKind OVar2;
  OpndKind OVar3;
  bool bVar4;
  bool bVar5;
  undefined4 *puVar6;
  ListOpndType *pLVar7;
  StackSym *pSVar8;
  PropertySymOpnd *this;
  int i;
  
  if (dst != (Opnd *)0x0) {
    OVar2 = Opnd::GetKind(dst);
    OVar3 = Opnd::GetKind(dst);
    if (OVar2 == OpndKindIndir) {
      if (OVar3 != OpndKindIndir) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
        if (!bVar4) {
LAB_004c0661:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar6 = 0;
      }
      if (((dst[1]._vptr_Opnd != (_func_int **)0x0) && ((StackSym *)dst[1]._vptr_Opnd[2] == sym)) ||
         ((*(long *)&dst[1].m_valueType != 0 &&
          (*(StackSym **)(*(long *)&dst[1].m_valueType + 0x10) == sym)))) {
        return true;
      }
    }
    else {
      OVar2 = Opnd::GetKind(dst);
      if (OVar3 == OpndKindList) {
        if (OVar2 != OpndKindList) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x1a4,"(this->IsListOpnd())","Bad call to AsListOpnd()");
          if (!bVar4) goto LAB_004c0661;
          *puVar6 = 0;
        }
        bVar4 = 0 < *(int *)&dst[1]._vptr_Opnd;
        if (0 < *(int *)&dst[1]._vptr_Opnd) {
          pLVar7 = ListOpnd::Item((ListOpnd *)dst,0);
          bVar5 = HasSymUseDst(sym,&pLVar7->super_Opnd);
          if (!bVar5) {
            i = 1;
            do {
              bVar4 = i < *(int *)&dst[1]._vptr_Opnd;
              if (*(int *)&dst[1]._vptr_Opnd <= i) {
                return false;
              }
              pLVar7 = ListOpnd::Item((ListOpnd *)dst,i);
              bVar5 = HasSymUseDst(sym,&pLVar7->super_Opnd);
              i = i + 1;
            } while (!bVar5);
          }
          if (bVar4) {
            return true;
          }
        }
      }
      else if (OVar2 == OpndKindSym) {
        OVar2 = Opnd::GetKind(dst);
        if (OVar2 != OpndKindSym) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
          if (!bVar4) goto LAB_004c0661;
          *puVar6 = 0;
        }
        pSVar8 = (StackSym *)Opnd::GetSym(dst);
        if (pSVar8 == sym) {
          return true;
        }
        bVar4 = SymOpnd::IsPropertySymOpnd((SymOpnd *)dst);
        if (bVar4) {
          this = Opnd::AsPropertySymOpnd(dst);
          pSVar8 = PropertySymOpnd::GetObjectSym(this);
          if (pSVar8 == sym) {
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool
Instr::HasSymUseDst(StackSym *sym, IR::Opnd* dst)
{
    if (!dst)
    {
        return false;
    }
    if (dst->IsIndirOpnd())
    {
        IR::IndirOpnd *indirOpnd = dst->AsIndirOpnd();
        RegOpnd * baseOpnd = indirOpnd->GetBaseOpnd();
        if (baseOpnd != nullptr && baseOpnd->m_sym == sym)
        {
            return true;
        }
        else if (indirOpnd->GetIndexOpnd() && indirOpnd->GetIndexOpnd()->m_sym == sym)
        {
            return true;
        }
    }
    else if (dst->IsListOpnd())
    {
        IR::ListOpnd* list = dst->AsListOpnd();
        for (int i = 0; i < list->Count(); ++i)
        {
            if (HasSymUseDst(sym, list->Item(i)))
            {
                return true;
            }
        }
    }
    else if (dst->IsSymOpnd())
    {
        SymOpnd* symOpnd = dst->AsSymOpnd();
        if (symOpnd->GetSym() == sym)
        {
            return true;
        }
        if (symOpnd->IsPropertySymOpnd())
        {
            PropertySymOpnd* propertySymOpnd = symOpnd->AsPropertySymOpnd();
            if (propertySymOpnd->GetObjectSym() == sym)
            {
                return true;
            }
        }
    }
    return false;
}